

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall
duckdb_parquet::DictionaryPageHeader::printTo(DictionaryPageHeader *this,ostream *out)

{
  ostream *poVar1;
  type *val;
  string local_40;
  
  std::operator<<(out,"DictionaryPageHeader(");
  poVar1 = std::operator<<(out,"num_values=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->num_values);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"encoding=");
  to_string_abi_cxx11_(&local_40,(duckdb_parquet *)&this->encoding,val);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  std::operator<<(poVar1,"is_sorted=");
  if (((byte)this->__isset & 1) == 0) {
    std::operator<<(out,"<null>");
  }
  else {
    duckdb_apache::thrift::to_string<bool>(&local_40,&this->is_sorted);
    std::operator<<(out,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::operator<<(out,")");
  return;
}

Assistant:

void DictionaryPageHeader::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DictionaryPageHeader(";
  out << "num_values=" << to_string(num_values);
  out << ", " << "encoding=" << to_string(encoding);
  out << ", " << "is_sorted="; (__isset.is_sorted ? (out << to_string(is_sorted)) : (out << "<null>"));
  out << ")";
}